

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_idifference(LispPTR tosm1,LispPTR tos)

{
  float fVar1;
  ushort uVar2;
  LispPTR *pLVar3;
  float *pfVar4;
  uint *NAddr;
  uint uVar5;
  int *fixpp;
  float temp_1;
  float temp;
  int result;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tosm1 & 0xfff0000) == 0xe0000) {
    result = tosm1 & 0xffff;
  }
  else if ((tosm1 & 0xfff0000) == 0xf0000) {
    result = tosm1 | 0xffff0000;
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff;
    if (uVar2 == 2) {
      pLVar3 = NativeAligned4FromLAddr(tosm1);
      result = *pLVar3;
    }
    else {
      if (uVar2 != 3) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar4 = (float *)NativeAligned4FromLAddr(tosm1);
      fVar1 = *pfVar4;
      if (2.1474836e+09 < fVar1) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (fVar1 < 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      result = (int)fVar1;
    }
  }
  if ((tos & 0xfff0000) == 0xe0000) {
    temp = (float)(tos & 0xffff);
  }
  else if ((tos & 0xfff0000) == 0xf0000) {
    temp = (float)(tos | 0xffff0000);
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff;
    if (uVar2 != 2) {
      if (uVar2 == 3) {
        pfVar4 = (float *)NativeAligned4FromLAddr(tos);
        fVar1 = *pfVar4;
        if ((fVar1 <= 2.1474836e+09) && (2.1474836e+09 <= fVar1)) {
          temp = (float)(int)fVar1;
          goto LAB_00108196;
        }
      }
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pfVar4 = (float *)NativeAligned4FromLAddr(tos);
    temp = *pfVar4;
  }
LAB_00108196:
  uVar5 = result - (int)temp;
  if (SBORROW4(result,(int)temp)) {
    MachineState.errorexit = 1;
    tos_local = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  else if (uVar5 >> 0x10 == 0xffff) {
    tos_local = uVar5 & 0xffff | 0xf0000;
  }
  else if (uVar5 >> 0x10 == 0) {
    tos_local = uVar5 | 0xe0000;
  }
  else {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar5;
    tos_local = LAddrFromNative(NAddr);
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_idifference(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tosm1, arg1, doufn);
  N_IGETNUMBER(tos, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_ssub_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: -2147483647 - 100 cannot be represented in type 'int' */
  result = arg1 - arg2;
  if (((arg1 >= 0) == (arg2 < 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif
doufn:
  ERROR_EXIT(tos);
}